

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_oid.hpp
# Opt level: O0

uint8_t jsoncons::bson::oid_t::parse_hex_char(char hex)

{
  char hex_local;
  uint8_t local_1;
  
  switch(hex) {
  case '0':
    local_1 = '\0';
    break;
  case '1':
    local_1 = '\x01';
    break;
  case '2':
    local_1 = '\x02';
    break;
  case '3':
    local_1 = '\x03';
    break;
  case '4':
    local_1 = '\x04';
    break;
  case '5':
    local_1 = '\x05';
    break;
  case '6':
    local_1 = '\x06';
    break;
  case '7':
    local_1 = '\a';
    break;
  case '8':
    local_1 = '\b';
    break;
  case '9':
    local_1 = '\t';
    break;
  default:
    local_1 = '\0';
    break;
  case 'A':
  case 'a':
    local_1 = '\n';
    break;
  case 'B':
  case 'b':
    local_1 = '\v';
    break;
  case 'C':
  case 'c':
    local_1 = '\f';
    break;
  case 'D':
  case 'd':
    local_1 = '\r';
    break;
  case 'E':
  case 'e':
    local_1 = '\x0e';
    break;
  case 'F':
  case 'f':
    local_1 = '\x0f';
  }
  return local_1;
}

Assistant:

static uint8_t parse_hex_char (char hex)
        {
           switch (hex) {
           case '0':
              return 0;
           case '1':
              return 1;
           case '2':
              return 2;
           case '3':
              return 3;
           case '4':
              return 4;
           case '5':
              return 5;
           case '6':
              return 6;
           case '7':
              return 7;
           case '8':
              return 8;
           case '9':
              return 9;
           case 'a':
           case 'A':
              return 0xa;
           case 'b':
           case 'B':
              return 0xb;
           case 'c':
           case 'C':
              return 0xc;
           case 'd':
           case 'D':
              return 0xd;
           case 'e':
           case 'E':
              return 0xe;
           case 'f':
           case 'F':
              return 0xf;
           default:
              return 0;
           }
        }